

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O2

int ApprovalTests::
    TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int extraout_EAX;
  Reporter *siglen_00;
  Options *local_28;
  
  Options::getNamer((Options *)&stack0xffffffffffffffd8);
  siglen_00 = Options::getReporter((Options *)sig);
  FileApprover::verify((EVP_PKEY_CTX *)local_28,(uchar *)ctx,(size_t)siglen_00,tbs,tbslen);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return extraout_EAX;
}

Assistant:

static void verify(const ApprovalWriter& writer,
                           const Options& options = Options())
        {
            FileApprover::verify(*options.getNamer(), writer, options.getReporter());
        }